

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem_unix.c
# Opt level: O0

w_status w_vmem_commit(w_vmem *mem,void *addr,size_t size)

{
  wp_vmem_trace_data *pwVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  int error_1;
  int error;
  wp_vmem_trace_data *trace_data;
  size_t size_local;
  void *addr_local;
  w_vmem *mem_local;
  
  trace_data = (wp_vmem_trace_data *)size;
  size_local = (size_t)addr;
  addr_local = mem;
  iVar2 = w_mtx_lock(&wp_vmem_tracer_mtx);
  if (iVar2 != 0) {
    w_abort(-8);
  }
  wp_trace_pool_find_data
            ((void **)&error_1,wp_vmem_tracer_inst.idx_pool,wp_vmem_tracer_inst.data_pool,0x400,8,
             addr_local);
  iVar2 = w_mtx_unlock(&wp_vmem_tracer_mtx);
  if (iVar2 != 0) {
    w_abort(-0xc);
  }
  if (size_local < *addr_local) {
    w_handle_failed_assertion
              ("(uintptr_t)addr >= (uintptr_t)mem->addr","w_vmem_commit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0xac);
  }
  if ((ulong)(*addr_local + *_error_1) < (long)&trace_data->size + size_local) {
    w_handle_failed_assertion
              ("(uintptr_t)addr + size <= (uintptr_t)mem->addr + trace_data->size","w_vmem_commit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0xaf);
  }
  if (addr_local == (void *)0x0) {
    w_handle_failed_assertion
              ("mem != NULL","w_vmem_commit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0xb3);
  }
  if (*addr_local == 0) {
    w_handle_failed_assertion
              ("mem->addr != NULL","w_vmem_commit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0xb4);
  }
  if (size_local == 0) {
    w_handle_failed_assertion
              ("addr != NULL","w_vmem_commit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0xb5);
  }
  if (trace_data == (wp_vmem_trace_data *)0x0) {
    w_handle_failed_assertion
              ("size > 0","w_vmem_commit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0xb6);
  }
  pwVar1 = trace_data;
  sVar3 = w_get_commit_granularity();
  if ((ulong)pwVar1 % sVar3 != 0) {
    w_handle_failed_assertion
              ("size % w_get_commit_granularity() == 0","w_vmem_commit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0xb7);
  }
  iVar2 = mprotect((void *)size_local,(size_t)trace_data,3);
  if (iVar2 == 0) {
    iVar2 = madvise((void *)size_local,(size_t)trace_data,3);
    if (iVar2 != 0) {
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      wp_log(W_LOG_LVL_WARNING,
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
             ,200,"failed to advise %zu bytes of virtual memory at %p\n",trace_data,size_local);
      wp_log_system_error(W_LOG_LVL_ALL,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
                          ,0xc9,iVar2);
    }
    mem_local._4_4_ = W_SUCCESS;
  }
  else {
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    wp_log(W_LOG_LVL_ERROR,
           "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
           ,0xbe,"failed to commit %zu bytes of virtual memory at %p\n",trace_data,size_local);
    wp_log_system_error(W_LOG_LVL_ALL,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
                        ,0xbf,iVar2);
    mem_local._4_4_ = W_ERROR_ALLOC_FAILED;
  }
  return mem_local._4_4_;
}

Assistant:

enum w_status
w_vmem_commit(
    struct w_vmem *mem,
    void *addr,
    size_t size
)
{
#if W_TRACING(ENABLED)
    {
        struct wp_vmem_trace_data *trace_data;

        W_TRACER_FIND_DATA(wp_vmem_tracer, &trace_data, mem);
        W_ASSERT(
            (uintptr_t)addr >= (uintptr_t)mem->addr
        );
        W_ASSERT(
            (uintptr_t)addr + size <= (uintptr_t)mem->addr + trace_data->size
        );
    }
#endif

    W_ASSERT(mem != NULL);
    W_ASSERT(mem->addr != NULL);
    W_ASSERT(addr != NULL);
    W_ASSERT(size > 0);
    W_ASSERT(size % w_get_commit_granularity() == 0);

    if (mprotect(addr, size, PROT_READ | PROT_WRITE) != 0)
    {
        int error;

        error = errno;
        W_LOG_ERROR(WP_VMEM_GET_ERROR_MSG("commit"), size, addr);
        W_LOG_SYSTEM_ERROR(W_LOG_LVL_DEBUG, error);
        return W_ERROR_ALLOC_FAILED;
    }

    if (madvise(addr, size, MADV_WILLNEED) != 0)
    {
        int error;

        error = errno;
        W_LOG_WARNING(WP_VMEM_GET_ERROR_MSG("advise"), size, addr);
        W_LOG_SYSTEM_ERROR(W_LOG_LVL_DEBUG, error);
    }

    return W_SUCCESS;
}